

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderTCTEDataPassThrough::executeTestRun
          (TessellationShaderTCTEDataPassThrough *this,_run *run,
          _tessellation_primitive_mode primitive_mode,bool should_use_geometry_shader,
          bool should_pass_point_size_data_in_gs,bool should_pass_point_size_data_in_ts)

{
  ulong uVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  GLenum GVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  string *psVar7;
  TestError *this_00;
  long lVar8;
  float *pfVar9;
  _tessellation_primitive_mode primitive_mode_00;
  undefined1 local_810 [8];
  _vec4 new_entry_4;
  float *patch_data_ptr;
  float *pointSize_ptr_1;
  float *pointSize_ptr;
  _vec4 new_entry_3;
  float *position_data_1;
  _ivec4 new_entry_2;
  int *value2_data;
  _vec4 new_entry_1;
  float *value1_data;
  _vec4 new_entry;
  float *position_data;
  char *data;
  uint n_tess_coord;
  void *bo_ptr;
  float fStack_768;
  GLenum tf_mode;
  float tess_levels [4];
  uint local_750;
  uint n_result_tess_coords;
  uint bo_size;
  GLint link_status;
  GLuint shader;
  uint n_shader;
  uint n_shaders;
  GLuint shaders [5];
  char *local_718;
  char *non_gs_point_size_varyings [7];
  char *local_6d8;
  char *non_gs_non_point_size_varyings [5];
  char *local_6a8;
  char *gs_point_size_varyings [6];
  char *gs_non_point_size_varyings [4];
  int local_64c;
  char **ppcStack_648;
  uint varyings_size;
  char **varyings;
  uint varying_value2_size;
  uint varying_value1_size;
  uint varying_position_size;
  uint varying_pointSize_size;
  uint varying_patch_data_size;
  int varying_te_position_offset;
  int varying_te_pointSize_offset;
  int varying_te_patch_data_offset;
  int varying_tc_value2_offset;
  int varying_tc_value1_offset;
  int varying_tc_position_offset;
  int varying_tc_pointSize_offset;
  uint n_varyings;
  GLchar *local_5e8;
  char *body_raw_ptr_2;
  string body_string_2;
  stringstream body_sstream_2;
  ostream local_5b0;
  ulong local_438;
  size_t primitive_mode_token_position;
  string local_428 [8];
  string primitive_mode_token;
  string primitive_mode_replacement;
  GLchar *local_3c8;
  char *body_raw_ptr_1;
  string body_string_1;
  stringstream body_sstream_1;
  ostream local_390;
  string local_218 [48];
  GLchar *local_1e8;
  char *body_raw_ptr;
  string body_string;
  stringstream body_sstream;
  ostream local_1b0;
  char *local_38;
  char *fs_body;
  char *vs_body;
  Functions *gl;
  bool should_pass_point_size_data_in_ts_local;
  bool should_pass_point_size_data_in_gs_local;
  bool should_use_geometry_shader_local;
  _run *p_Stack_18;
  _tessellation_primitive_mode primitive_mode_local;
  _run *run_local;
  TessellationShaderTCTEDataPassThrough *this_local;
  
  run->primitive_mode = primitive_mode;
  gl._1_1_ = should_pass_point_size_data_in_ts;
  gl._2_1_ = should_pass_point_size_data_in_gs;
  gl._3_1_ = should_use_geometry_shader;
  gl._4_4_ = primitive_mode;
  p_Stack_18 = run;
  run_local = (_run *)this;
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar6->_vptr_RenderContext[3])();
  vs_body = (char *)CONCAT44(extraout_var,iVar2);
  GVar3 = (**(code **)(vs_body + 0x3c8))();
  p_Stack_18->po_id = GVar3;
  dVar4 = (**(code **)(vs_body + 0x800))();
  glu::checkError(dVar4,"glCreateProgram() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x132);
  GVar3 = (**(code **)(vs_body + 0x3f0))(0x8b30);
  p_Stack_18->fs_id = GVar3;
  GVar3 = (**(code **)(vs_body + 0x3f0))
                    ((this->super_TestCaseBase).m_glExtTokens.TESS_CONTROL_SHADER);
  p_Stack_18->tcs_id = GVar3;
  GVar3 = (**(code **)(vs_body + 0x3f0))
                    ((this->super_TestCaseBase).m_glExtTokens.TESS_EVALUATION_SHADER);
  p_Stack_18->tes_id = GVar3;
  GVar3 = (**(code **)(vs_body + 0x3f0))(0x8b31);
  p_Stack_18->vs_id = GVar3;
  if ((gl._3_1_ & 1) != 0) {
    GVar3 = (**(code **)(vs_body + 0x3f0))((this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER)
    ;
    p_Stack_18->gs_id = GVar3;
  }
  dVar4 = (**(code **)(vs_body + 0x800))();
  glu::checkError(dVar4,"glCreateShader() call(s) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x13f);
  (**(code **)(vs_body + 0x10))(p_Stack_18->po_id,p_Stack_18->fs_id);
  (**(code **)(vs_body + 0x10))(p_Stack_18->po_id,p_Stack_18->tcs_id);
  (**(code **)(vs_body + 0x10))(p_Stack_18->po_id,p_Stack_18->tes_id);
  (**(code **)(vs_body + 0x10))(p_Stack_18->po_id,p_Stack_18->vs_id);
  if ((gl._3_1_ & 1) != 0) {
    (**(code **)(vs_body + 0x10))(p_Stack_18->po_id,p_Stack_18->gs_id);
  }
  dVar4 = (**(code **)(vs_body + 0x800))();
  glu::checkError(dVar4,"glAttachShader() call(s) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x14c);
  fs_body = 
  "${VERSION}\n\n${SHADER_IO_BLOCKS_REQUIRE}\n\nout OUT_VS\n{\n    vec4  value1;\n    ivec4 value2;\n} out_data;\n\nvoid main()\n{\n    gl_Position     = vec4( float(gl_VertexID) );\n    gl_PointSize    = 1.0 / float(gl_VertexID + 1);\n    out_data.value1 =  vec4(float(gl_VertexID),        float(gl_VertexID) * 0.5,\n                            float(gl_VertexID) * 0.25, float(gl_VertexID) * 0.125);\n    out_data.value2 = ivec4(gl_VertexID,               gl_VertexID + 1,\n                            gl_VertexID + 2,           gl_VertexID + 3);\n}\n"
  ;
  TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,p_Stack_18->vs_id,1,&fs_body);
  dVar4 = (**(code **)(vs_body + 0x800))();
  glu::checkError(dVar4,"glShaderSource() call failed for vertex shader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x164);
  local_38 = "${VERSION}\n\nvoid main()\n{\n}\n";
  TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,p_Stack_18->fs_id,1,&local_38);
  dVar4 = (**(code **)(vs_body + 0x800))();
  glu::checkError(dVar4,"glShaderSource() call failed for fragment shader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x16e);
  std::__cxx11::stringstream::stringstream((stringstream *)(body_string.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&body_raw_ptr);
  local_1e8 = (GLchar *)0x0;
  std::operator<<(&local_1b0,"${VERSION}\n\n${TESSELLATION_SHADER_REQUIRE}\n");
  if ((gl._1_1_ & 1) != 0) {
    std::operator<<(&local_1b0,"${TESSELLATION_POINT_SIZE_REQUIRE}\n");
  }
  std::operator<<(&local_1b0,
                  "\nlayout(vertices = 2) out;\n\nin OUT_VS\n{\n    vec4  value1;\n    ivec4 value2;\n} in_vs_data[];\n\nout OUT_TC\n{\n"
                 );
  if ((gl._1_1_ & 1) != 0) {
    std::operator<<(&local_1b0,"    float tc_pointSize;\n");
  }
  std::operator<<(&local_1b0,
                  "     vec4  tc_position;\n     vec4  tc_value1;\n    ivec4  tc_value2;\n} out_data[];\n\npatch out vec4 tc_patch_data;\n\nvoid main()\n{\n    int multiplier = 1;\n\n    if (gl_InvocationID == 0)\n    {\n        multiplier = 2;\n    }\n"
                 );
  if ((gl._1_1_ & 1) != 0) {
    std::operator<<(&local_1b0,
                    "    out_data         [gl_InvocationID].tc_pointSize = gl_in[0].gl_PointSize;\n    gl_out           [gl_InvocationID].gl_PointSize = gl_in[0].gl_PointSize * 2.0;\n"
                   );
  }
  std::operator<<(&local_1b0,
                  "    out_data         [gl_InvocationID].tc_position  = gl_in     [0].gl_Position;\n    out_data         [gl_InvocationID].tc_value1    = in_vs_data[0].value1      *  vec4(float(multiplier) );\n    out_data         [gl_InvocationID].tc_value2    = in_vs_data[0].value2      * ivec4(      multiplier);\n    gl_out           [gl_InvocationID].gl_Position  = gl_in     [0].gl_Position + vec4(3.0);\n    gl_TessLevelInner[0]                            = 4.0;\n    gl_TessLevelInner[1]                            = 4.0;\n    gl_TessLevelOuter[0]                            = 4.0;\n    gl_TessLevelOuter[1]                            = 4.0;\n    gl_TessLevelOuter[2]                            = 4.0;\n    gl_TessLevelOuter[3]                            = 4.0;\n\n    if (gl_InvocationID == 0)\n    {\n        tc_patch_data = in_vs_data[0].value1 *  vec4(float(multiplier) );\n    }\n}\n"
                 );
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)&body_raw_ptr,local_218);
  std::__cxx11::string::~string(local_218);
  local_1e8 = (GLchar *)std::__cxx11::string::c_str();
  TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,p_Stack_18->tcs_id,1,&local_1e8);
  dVar4 = (**(code **)(vs_body + 0x800))();
  glu::checkError(dVar4,"glShaderSource() call failed for tessellation control shader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x1bd);
  std::__cxx11::string::~string((string *)&body_raw_ptr);
  std::__cxx11::stringstream::~stringstream((stringstream *)(body_string.field_2._M_local_buf + 8));
  std::__cxx11::stringstream::stringstream((stringstream *)(body_string_1.field_2._M_local_buf + 8))
  ;
  std::__cxx11::string::string((string *)&body_raw_ptr_1);
  local_3c8 = (GLchar *)0x0;
  std::operator<<(&local_390,"${VERSION}\n\n${TESSELLATION_SHADER_REQUIRE}\n");
  if ((gl._1_1_ & 1) != 0) {
    std::operator<<(&local_390,"${TESSELLATION_POINT_SIZE_REQUIRE}\n");
  }
  std::operator<<(&local_390,"\nlayout(PRIMITIVE_MODE, point_mode) in;\n\nin OUT_TC\n{\n");
  if ((gl._1_1_ & 1) != 0) {
    std::operator<<(&local_390,"    float tc_pointSize;\n");
  }
  std::operator<<(&local_390,
                  "    vec4  tc_position;\n    vec4  tc_value1;\n   ivec4  tc_value2;\n} in_data[];\n\npatch in vec4 tc_patch_data;\n\n"
                 );
  if ((gl._3_1_ & 1) == 0) {
    if ((gl._1_1_ & 1) != 0) {
      std::operator<<(&local_390,"out float tc_pointSize;\nout float te_pointSize;\n");
    }
    std::operator<<(&local_390,
                    "out  vec4  tc_position;\nout  vec4  tc_value1;\nflat out ivec4  tc_value2;\nout  vec4  te_position;\nout  vec4  te_patch_data;\n"
                   );
  }
  else {
    std::operator<<(&local_390,"out OUT_TE\n{\n");
    if ((gl._1_1_ & 1) != 0) {
      std::operator<<(&local_390,"    float tc_pointSize;\n    float te_pointSize;\n");
    }
    std::operator<<(&local_390,
                    "    vec4  tc_position;\n    vec4  tc_value1;\n   ivec4  tc_value2;\n    vec4  te_position;\n} out_data;\n"
                   );
  }
  std::operator<<(&local_390,"\nvoid main()\n{\n");
  if ((gl._3_1_ & 1) == 0) {
    std::operator<<(&local_390,"#define OUTPUT_VARIABLE(x) x\n");
  }
  else {
    std::operator<<(&local_390,"#define OUTPUT_VARIABLE(x) out_data.x\n");
  }
  if ((gl._1_1_ & 1) != 0) {
    std::operator<<(&local_390,
                    "    OUTPUT_VARIABLE(tc_pointSize) = in_data[1].tc_pointSize;\n    OUTPUT_VARIABLE(te_pointSize) = gl_in[1].gl_PointSize;\n"
                   );
  }
  std::operator<<(&local_390,
                  "    OUTPUT_VARIABLE(tc_position)   = in_data[1].tc_position;\n    OUTPUT_VARIABLE(tc_value1)     = in_data[0].tc_value1;\n    OUTPUT_VARIABLE(tc_value2)     = in_data[1].tc_value2;\n    OUTPUT_VARIABLE(te_position)   = gl_in[0].gl_Position;\n"
                 );
  if ((gl._3_1_ & 1) == 0) {
    std::operator<<(&local_390,"    OUTPUT_VARIABLE(te_patch_data) = tc_patch_data;\n");
  }
  std::operator<<(&local_390,"}\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=
            ((string *)&body_raw_ptr_1,
             (string *)(primitive_mode_replacement.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(primitive_mode_replacement.field_2._M_local_buf + 8));
  TessellationShaderUtils::getESTokenForPrimitiveMode_abi_cxx11_
            ((string *)((long)&primitive_mode_token.field_2 + 8),
             (TessellationShaderUtils *)(ulong)gl._4_4_,primitive_mode_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_428,"PRIMITIVE_MODE",
             (allocator<char> *)((long)&primitive_mode_token_position + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&primitive_mode_token_position + 7));
  local_438 = 0xffffffffffffffff;
  local_438 = std::__cxx11::string::find((string *)&body_raw_ptr_1,(ulong)local_428);
  while (uVar1 = local_438, local_438 != 0xffffffffffffffff) {
    psVar7 = (string *)std::__cxx11::string::length();
    psVar7 = (string *)std::__cxx11::string::replace((ulong)&body_raw_ptr_1,uVar1,psVar7);
    std::__cxx11::string::operator=((string *)&body_raw_ptr_1,psVar7);
    local_438 = std::__cxx11::string::find((string *)&body_raw_ptr_1,(ulong)local_428);
  }
  local_3c8 = (GLchar *)std::__cxx11::string::c_str();
  TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,p_Stack_18->tes_id,1,&local_3c8);
  dVar4 = (**(code **)(vs_body + 0x800))();
  glu::checkError(dVar4,"glShaderSource() call failed for tessellation evaluation shader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x23c);
  std::__cxx11::string::~string(local_428);
  std::__cxx11::string::~string((string *)(primitive_mode_token.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&body_raw_ptr_1);
  std::__cxx11::stringstream::~stringstream
            ((stringstream *)(body_string_1.field_2._M_local_buf + 8));
  if ((gl._3_1_ & 1) != 0) {
    std::__cxx11::stringstream::stringstream
              ((stringstream *)(body_string_2.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)&body_raw_ptr_2);
    local_5e8 = (GLchar *)0x0;
    std::operator<<(&local_5b0,"${VERSION}\n\n${GEOMETRY_SHADER_REQUIRE}\n");
    if ((gl._2_1_ & 1) != 0) {
      std::operator<<(&local_5b0,"${GEOMETRY_POINT_SIZE_REQUIRE}\n");
    }
    std::operator<<(&local_5b0,
                    "${SHADER_IO_BLOCKS_REQUIRE}\n\nlayout(points)                   in;\nlayout(max_vertices = 2, points) out;\n\nin OUT_TE\n{\n"
                   );
    if ((gl._1_1_ & 1) != 0) {
      std::operator<<(&local_5b0,"    float tc_pointSize;\n    float te_pointSize;\n");
    }
    std::operator<<(&local_5b0,
                    "    vec4  tc_position;\n    vec4  tc_value1;\n   ivec4  tc_value2;\n    vec4  te_position;\n} in_data[1];\n\nout float gs_tc_pointSize;\nout float gs_te_pointSize;\nout  vec4 gs_tc_position;\nout  vec4 gs_tc_value1;\nflat out ivec4 gs_tc_value2;\nout  vec4 gs_te_position;\n\nvoid main()\n{\n"
                   );
    if ((gl._2_1_ & 1) != 0) {
      std::operator<<(&local_5b0,
                      "    gs_tc_pointSize = in_data[0].tc_pointSize;\n    gs_te_pointSize = in_data[0].te_pointSize;\n"
                     );
    }
    std::operator<<(&local_5b0,
                    "    gs_tc_position = in_data[0].tc_position;\n    gs_tc_value1   = in_data[0].tc_value1;\n    gs_tc_value2   = in_data[0].tc_value2;\n    gs_te_position = in_data[0].te_position;\n    EmitVertex();\n"
                   );
    if ((gl._2_1_ & 1) != 0) {
      std::operator<<(&local_5b0,
                      "    gs_tc_pointSize = in_data[0].tc_pointSize + 1.0;\n    gs_te_pointSize = in_data[0].te_pointSize + 1.0;\n"
                     );
    }
    std::operator<<(&local_5b0,
                    "    gs_tc_position = in_data[0].tc_position +  vec4(1.0);\n    gs_tc_value1   = in_data[0].tc_value1   +  vec4(1.0);\n    gs_tc_value2   = in_data[0].tc_value2   + ivec4(1);\n    gs_te_position = in_data[0].te_position +  vec4(1.0);\n\n    EmitVertex();\n\n}\n"
                   );
    std::__cxx11::stringstream::str();
    std::__cxx11::string::operator=
              ((string *)&body_raw_ptr_2,(string *)&varying_tc_pointSize_offset);
    std::__cxx11::string::~string((string *)&varying_tc_pointSize_offset);
    local_5e8 = (GLchar *)std::__cxx11::string::c_str();
    TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,p_Stack_18->gs_id,1,&local_5e8);
    dVar4 = (**(code **)(vs_body + 0x800))();
    glu::checkError(dVar4,"glShaderSource() call failed for geometry shader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0x28c);
    std::__cxx11::string::~string((string *)&body_raw_ptr_2);
    std::__cxx11::stringstream::~stringstream
              ((stringstream *)(body_string_2.field_2._M_local_buf + 8));
  }
  varying_tc_value1_offset = -1;
  varying_te_position_offset = -1;
  varying_patch_data_size = 0xffffffff;
  gs_point_size_varyings[5] = "gs_tc_position";
  memcpy(&local_6a8,&PTR_anon_var_dwarf_802b53_03262710,0x30);
  memcpy(&local_6d8,&DAT_03262740,0x28);
  memcpy(&local_718,&DAT_03262770,0x38);
  if ((gl._3_1_ & 1) == 0) {
    if ((gl._1_1_ & 1) == 0) {
      varying_tc_position_offset = 5;
      ppcStack_648 = &local_6d8;
      local_64c = 0x50;
      varying_te_position_offset = 0x40;
    }
    else {
      varying_tc_position_offset = 7;
      ppcStack_648 = &local_718;
      local_64c = 0x58;
      varying_tc_value1_offset = 0x40;
      varying_patch_data_size = 0x44;
      varying_te_position_offset = 0x48;
    }
  }
  else if ((gl._2_1_ & 1) == 0) {
    varying_tc_position_offset = 4;
    ppcStack_648 = gs_point_size_varyings + 5;
    local_64c = 0x40;
  }
  else {
    varying_tc_position_offset = 6;
    ppcStack_648 = &local_6a8;
    local_64c = 0x48;
    varying_tc_value1_offset = 0x40;
    varying_patch_data_size = 0x44;
  }
  (**(code **)(vs_body + 0x14c8))(p_Stack_18->po_id,varying_tc_position_offset,ppcStack_648,0x8c8c);
  dVar4 = (**(code **)(vs_body + 0x800))();
  glu::checkError(dVar4,"glTransformFeedbackVaryings() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x2f4);
  n_shader = p_Stack_18->fs_id;
  n_shaders = p_Stack_18->gs_id;
  shaders[0] = p_Stack_18->tcs_id;
  shaders[1] = p_Stack_18->tes_id;
  shaders[2] = p_Stack_18->vs_id;
  shader = 5;
  for (link_status = 0; (uint)link_status < 5; link_status = link_status + 1) {
    bo_size = (&n_shader)[(uint)link_status];
    if (bo_size != 0) {
      TessellationShaderUtils::compileShaders(this->m_utils_ptr,1,&bo_size,true);
    }
  }
  (**(code **)(vs_body + 0xce8))(p_Stack_18->po_id);
  dVar4 = (**(code **)(vs_body + 0x800))();
  glu::checkError(dVar4,"glLinkProgram() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x306);
  n_result_tess_coords = 0;
  (**(code **)(vs_body + 0x9d8))(p_Stack_18->po_id,0x8b82,&n_result_tess_coords);
  dVar4 = (**(code **)(vs_body + 0x800))();
  glu::checkError(dVar4,"glGetProgramiv() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x30c);
  if (n_result_tess_coords != 1) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Program linking failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
               ,0x310);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  _fStack_768 = 0x4080000040800000;
  tess_levels[0] = 4.0;
  tess_levels[1] = 4.0;
  local_750 = TessellationShaderUtils::getAmountOfVerticesGeneratedByTessellator
                        (this->m_utils_ptr,p_Stack_18->primitive_mode,&fStack_768,&fStack_768,
                         TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,true);
  if ((gl._3_1_ & 1) != 0) {
    local_750 = local_750 << 1;
  }
  p_Stack_18->n_result_vertices_per_patch = local_750;
  local_750 = this->m_n_input_vertices_per_run * local_750;
  iVar2 = local_750 * local_64c;
  (**(code **)(vs_body + 0x150))(0x8c8e,iVar2,0,0x88e4);
  dVar4 = (**(code **)(vs_body + 0x800))();
  glu::checkError(dVar4,"glBufferData() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x32c);
  GVar5 = TessellationShaderUtils::getTFModeForPrimitiveMode(p_Stack_18->primitive_mode,true);
  (**(code **)(vs_body + 0x1680))(p_Stack_18->po_id);
  dVar4 = (**(code **)(vs_body + 0x800))();
  glu::checkError(dVar4,"glUseProgram() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x333);
  (**(code **)(vs_body + 0x30))(GVar5);
  dVar4 = (**(code **)(vs_body + 0x800))();
  glu::checkError(dVar4,"glBeginTransformFeedback() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x336);
  (**(code **)(vs_body + 0x538))
            ((this->super_TestCaseBase).m_glExtTokens.PATCHES,0,this->m_n_input_vertices_per_run);
  dVar4 = (**(code **)(vs_body + 0x800))();
  glu::checkError(dVar4,"glDrawArrays() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x339);
  (**(code **)(vs_body + 0x638))();
  dVar4 = (**(code **)(vs_body + 0x800))();
  glu::checkError(dVar4,"glEndTransformFeedback() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x33c);
  lVar8 = (**(code **)(vs_body + 0xd00))(0x8c8e,0,iVar2,1);
  dVar4 = (**(code **)(vs_body + 0x800))();
  glu::checkError(dVar4,"glMapBufferRange() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x343);
  for (data._4_4_ = 0; data._4_4_ < local_750; data._4_4_ = data._4_4_ + 1) {
    pfVar9 = (float *)(lVar8 + (ulong)(data._4_4_ * local_64c));
    new_entry._8_8_ = pfVar9;
    _vec4::_vec4((_vec4 *)&value1_data,*pfVar9,pfVar9[1],pfVar9[2],pfVar9[3]);
    std::vector<glcts::_vec4,_std::allocator<glcts::_vec4>_>::push_back
              (&p_Stack_18->result_tc_position_data,(value_type *)&value1_data);
    new_entry_1._8_8_ = pfVar9 + 4;
    _vec4::_vec4((_vec4 *)&value2_data,*(float *)new_entry_1._8_8_,pfVar9[5],pfVar9[6],pfVar9[7]);
    std::vector<glcts::_vec4,_std::allocator<glcts::_vec4>_>::push_back
              (&p_Stack_18->result_tc_value1_data,(value_type *)&value2_data);
    new_entry_2._8_8_ = pfVar9 + 8;
    _ivec4::_ivec4((_ivec4 *)&position_data_1,(int)*(float *)new_entry_2._8_8_,(int)pfVar9[9],
                   (int)pfVar9[10],(int)pfVar9[0xb]);
    std::vector<glcts::_ivec4,_std::allocator<glcts::_ivec4>_>::push_back
              (&p_Stack_18->result_tc_value2_data,(value_type *)&position_data_1);
    new_entry_3._8_8_ = pfVar9 + 0xc;
    _vec4::_vec4((_vec4 *)&pointSize_ptr,*(float *)new_entry_3._8_8_,pfVar9[0xd],pfVar9[0xe],
                 pfVar9[0xf]);
    std::vector<glcts::_vec4,_std::allocator<glcts::_vec4>_>::push_back
              (&p_Stack_18->result_te_position_data,(value_type *)&pointSize_ptr);
    if (varying_tc_value1_offset != -1) {
      std::vector<float,_std::allocator<float>_>::push_back
                (&p_Stack_18->result_tc_pointSize_data,
                 (value_type_conflict2 *)((long)pfVar9 + (long)varying_tc_value1_offset));
    }
    if (varying_patch_data_size != 0xffffffff) {
      std::vector<float,_std::allocator<float>_>::push_back
                (&p_Stack_18->result_te_pointSize_data,
                 (value_type_conflict2 *)((long)pfVar9 + (long)(int)varying_patch_data_size));
    }
    if (varying_te_position_offset != -1) {
      new_entry_4._8_8_ = (long)pfVar9 + (long)varying_te_position_offset;
      _vec4::_vec4((_vec4 *)local_810,*(float *)new_entry_4._8_8_,*(float *)(new_entry_4._8_8_ + 4),
                   *(float *)(new_entry_4._8_8_ + 8),*(float *)(new_entry_4._8_8_ + 0xc));
      std::vector<glcts::_vec4,_std::allocator<glcts::_vec4>_>::push_back
                (&p_Stack_18->result_te_patch_data,(value_type *)local_810);
    }
  }
  (**(code **)(vs_body + 0x1670))(0x8c8e);
  dVar4 = (**(code **)(vs_body + 0x800))();
  glu::checkError(dVar4,"glUnmapBuffer() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,899);
  return;
}

Assistant:

void TessellationShaderTCTEDataPassThrough::executeTestRun(_run& run, _tessellation_primitive_mode primitive_mode,
														   bool should_use_geometry_shader,
														   bool should_pass_point_size_data_in_gs,
														   bool should_pass_point_size_data_in_ts)
{
	run.primitive_mode = primitive_mode;

	/* Retrieve ES entry-points before we start */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create a program object first */
	run.po_id = gl.createProgram();

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() failed");

	/* Create all shader objects we wil be later attaching to the program object */
	run.fs_id  = gl.createShader(GL_FRAGMENT_SHADER);
	run.tcs_id = gl.createShader(m_glExtTokens.TESS_CONTROL_SHADER);
	run.tes_id = gl.createShader(m_glExtTokens.TESS_EVALUATION_SHADER);
	run.vs_id  = gl.createShader(GL_VERTEX_SHADER);

	if (should_use_geometry_shader)
	{
		run.gs_id = gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed");

	/* Attach the shader objects to the program object */
	gl.attachShader(run.po_id, run.fs_id);
	gl.attachShader(run.po_id, run.tcs_id);
	gl.attachShader(run.po_id, run.tes_id);
	gl.attachShader(run.po_id, run.vs_id);

	if (should_use_geometry_shader)
	{
		gl.attachShader(run.po_id, run.gs_id);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call(s) failed");

	/* Set vertex shader's body */
	const char* vs_body = "${VERSION}\n"
						  "\n"
						  "${SHADER_IO_BLOCKS_REQUIRE}\n"
						  "\n"
						  "out OUT_VS\n"
						  "{\n"
						  "    vec4  value1;\n"
						  "    ivec4 value2;\n"
						  "} out_data;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    gl_Position     = vec4( float(gl_VertexID) );\n"
						  "    gl_PointSize    = 1.0 / float(gl_VertexID + 1);\n"
						  "    out_data.value1 =  vec4(float(gl_VertexID),        float(gl_VertexID) * 0.5,\n"
						  "                            float(gl_VertexID) * 0.25, float(gl_VertexID) * 0.125);\n"
						  "    out_data.value2 = ivec4(gl_VertexID,               gl_VertexID + 1,\n"
						  "                            gl_VertexID + 2,           gl_VertexID + 3);\n"
						  "}\n";

	shaderSourceSpecialized(run.vs_id, 1 /* count */, &vs_body);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed for vertex shader");

	/* Set dummy fragment shader's body */
	const char* fs_body = "${VERSION}\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "}\n";

	shaderSourceSpecialized(run.fs_id, 1 /* count */, &fs_body);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed for fragment shader");

	/* Set tessellation control shader's body */
	{
		std::stringstream body_sstream;
		std::string		  body_string;
		const char*		  body_raw_ptr = DE_NULL;

		body_sstream << "${VERSION}\n"
						"\n"
						"${TESSELLATION_SHADER_REQUIRE}\n";

		if (should_pass_point_size_data_in_ts)
		{
			body_sstream << "${TESSELLATION_POINT_SIZE_REQUIRE}\n";
		}

		body_sstream << "\n"
						"layout(vertices = 2) out;\n"
						"\n"
						"in OUT_VS\n"
						"{\n"
						"    vec4  value1;\n"
						"    ivec4 value2;\n"
						"} in_vs_data[];\n"
						"\n"
						"out OUT_TC\n"
						"{\n";

		if (should_pass_point_size_data_in_ts)
		{
			body_sstream << "    float tc_pointSize;\n";
		}

		body_sstream << "     vec4  tc_position;\n"
						"     vec4  tc_value1;\n"
						"    ivec4  tc_value2;\n"
						"} out_data[];\n"
						"\n"
						"patch out vec4 tc_patch_data;\n"
						"\n"
						"void main()\n"
						"{\n"
						"    int multiplier = 1;\n"
						"\n"
						"    if (gl_InvocationID == 0)\n"
						"    {\n"
						"        multiplier = 2;\n"
						"    }\n";

		if (should_pass_point_size_data_in_ts)
		{
			body_sstream << "    out_data         [gl_InvocationID].tc_pointSize = gl_in[0].gl_PointSize;\n"
							"    gl_out           [gl_InvocationID].gl_PointSize = gl_in[0].gl_PointSize * 2.0;\n";
		}

		body_sstream << "    out_data         [gl_InvocationID].tc_position  = gl_in     [0].gl_Position;\n"
						"    out_data         [gl_InvocationID].tc_value1    = in_vs_data[0].value1      *  "
						"vec4(float(multiplier) );\n"
						"    out_data         [gl_InvocationID].tc_value2    = in_vs_data[0].value2      * ivec4(      "
						"multiplier);\n"
						"    gl_out           [gl_InvocationID].gl_Position  = gl_in     [0].gl_Position + vec4(3.0);\n"
						"    gl_TessLevelInner[0]                            = 4.0;\n"
						"    gl_TessLevelInner[1]                            = 4.0;\n"
						"    gl_TessLevelOuter[0]                            = 4.0;\n"
						"    gl_TessLevelOuter[1]                            = 4.0;\n"
						"    gl_TessLevelOuter[2]                            = 4.0;\n"
						"    gl_TessLevelOuter[3]                            = 4.0;\n"
						"\n"
						"    if (gl_InvocationID == 0)\n"
						"    {\n"
						"        tc_patch_data = in_vs_data[0].value1 *  vec4(float(multiplier) );\n"
						"    }\n"
						"}\n";

		body_string  = body_sstream.str();
		body_raw_ptr = body_string.c_str();

		shaderSourceSpecialized(run.tcs_id, 1 /* count */, &body_raw_ptr);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed for tessellation control shader");
	}

	/* Set tessellation evaluation shader's body */
	{
		std::stringstream body_sstream;
		std::string		  body_string;
		const char*		  body_raw_ptr = DE_NULL;

		/* Preamble */
		body_sstream << "${VERSION}\n"
						"\n"
						"${TESSELLATION_SHADER_REQUIRE}\n";

		if (should_pass_point_size_data_in_ts)
		{
			body_sstream << "${TESSELLATION_POINT_SIZE_REQUIRE}\n";
		}

		/* Layout qualifiers */
		body_sstream << "\n"
						"layout(PRIMITIVE_MODE, point_mode) in;\n"
						"\n"

						/* Input block definition starts here: */
						"in OUT_TC\n"
						"{\n";

		if (should_pass_point_size_data_in_ts)
		{
			body_sstream << "    float tc_pointSize;\n";
		}

		body_sstream << "    vec4  tc_position;\n"
						"    vec4  tc_value1;\n"
						"   ivec4  tc_value2;\n"
						"} in_data[];\n"
						"\n"
						"patch in vec4 tc_patch_data;\n"
						"\n";
		/* Input block definition ends here. */

		/* Output block definition (only defined if GS stage is present) starts here: */
		if (should_use_geometry_shader)
		{
			body_sstream << "out OUT_TE\n"
							"{\n";

			/* Output block contents */
			if (should_pass_point_size_data_in_ts)
			{
				body_sstream << "    float tc_pointSize;\n"
								"    float te_pointSize;\n";
			}

			body_sstream << "    vec4  tc_position;\n"
							"    vec4  tc_value1;\n"
							"   ivec4  tc_value2;\n"
							"    vec4  te_position;\n"
							"} out_data;\n";
		}
		/* Output block definition ends here. */
		else
		{
			if (should_pass_point_size_data_in_ts)
			{
				body_sstream << "out float tc_pointSize;\n"
								"out float te_pointSize;\n";
			}

			body_sstream << "out  vec4  tc_position;\n"
							"out  vec4  tc_value1;\n"
							"flat out ivec4  tc_value2;\n"
							"out  vec4  te_position;\n"
							"out  vec4  te_patch_data;\n";
		}

		body_sstream << "\n"
						"void main()\n"
						"{\n";

		if (should_use_geometry_shader)
		{
			body_sstream << "#define OUTPUT_VARIABLE(x) out_data.x\n";
		}
		else
		{
			body_sstream << "#define OUTPUT_VARIABLE(x) x\n";
		}

		if (should_pass_point_size_data_in_ts)
		{
			body_sstream << "    OUTPUT_VARIABLE(tc_pointSize) = in_data[1].tc_pointSize;\n"
							"    OUTPUT_VARIABLE(te_pointSize) = gl_in[1].gl_PointSize;\n";
		}

		body_sstream << "    OUTPUT_VARIABLE(tc_position)   = in_data[1].tc_position;\n"
						"    OUTPUT_VARIABLE(tc_value1)     = in_data[0].tc_value1;\n"
						"    OUTPUT_VARIABLE(tc_value2)     = in_data[1].tc_value2;\n"
						"    OUTPUT_VARIABLE(te_position)   = gl_in[0].gl_Position;\n";

		if (!should_use_geometry_shader)
		{
			body_sstream << "    OUTPUT_VARIABLE(te_patch_data) = tc_patch_data;\n";
		}
		body_sstream << "}\n";

		body_string = body_sstream.str();

		/* Replace PRIMITIVE_MODE token with user-requested primitive mode */
		std::string primitive_mode_replacement	= TessellationShaderUtils::getESTokenForPrimitiveMode(primitive_mode);
		std::string primitive_mode_token		  = "PRIMITIVE_MODE";
		std::size_t primitive_mode_token_position = std::string::npos;

		primitive_mode_token_position = body_string.find(primitive_mode_token);

		while (primitive_mode_token_position != std::string::npos)
		{
			body_string = body_string.replace(primitive_mode_token_position, primitive_mode_token.length(),
											  primitive_mode_replacement);

			primitive_mode_token_position = body_string.find(primitive_mode_token);
		}

		body_raw_ptr = body_string.c_str();

		shaderSourceSpecialized(run.tes_id, 1 /* count */, &body_raw_ptr);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed for tessellation evaluation shader");
	}

	/* Set geometry shader's body (if requested) */
	if (should_use_geometry_shader)
	{
		std::stringstream body_sstream;
		std::string		  body_string;
		const char*		  body_raw_ptr = DE_NULL;

		body_sstream << "${VERSION}\n"
						"\n"
						"${GEOMETRY_SHADER_REQUIRE}\n";

		if (should_pass_point_size_data_in_gs)
		{
			body_sstream << "${GEOMETRY_POINT_SIZE_REQUIRE}\n";
		}

		body_sstream << "${SHADER_IO_BLOCKS_REQUIRE}\n"
						"\n"
						"layout(points)                   in;\n"
						"layout(max_vertices = 2, points) out;\n"
						"\n"
						"in OUT_TE\n"
						"{\n";

		if (should_pass_point_size_data_in_ts)
		{
			body_sstream << "    float tc_pointSize;\n"
							"    float te_pointSize;\n";
		}

		body_sstream << "    vec4  tc_position;\n"
						"    vec4  tc_value1;\n"
						"   ivec4  tc_value2;\n"
						"    vec4  te_position;\n"
						"} in_data[1];\n"
						"\n"
						"out float gs_tc_pointSize;\n"
						"out float gs_te_pointSize;\n"
						"out  vec4 gs_tc_position;\n"
						"out  vec4 gs_tc_value1;\n"
						"flat out ivec4 gs_tc_value2;\n"
						"out  vec4 gs_te_position;\n"
						"\n"
						"void main()\n"
						"{\n";

		if (should_pass_point_size_data_in_gs)
		{
			body_sstream << "    gs_tc_pointSize = in_data[0].tc_pointSize;\n"
							"    gs_te_pointSize = in_data[0].te_pointSize;\n";
		}

		body_sstream << "    gs_tc_position = in_data[0].tc_position;\n"
						"    gs_tc_value1   = in_data[0].tc_value1;\n"
						"    gs_tc_value2   = in_data[0].tc_value2;\n"
						"    gs_te_position = in_data[0].te_position;\n"
						"    EmitVertex();\n";

		if (should_pass_point_size_data_in_gs)
		{
			body_sstream << "    gs_tc_pointSize = in_data[0].tc_pointSize + 1.0;\n"
							"    gs_te_pointSize = in_data[0].te_pointSize + 1.0;\n";
		}

		body_sstream << "    gs_tc_position = in_data[0].tc_position +  vec4(1.0);\n"
						"    gs_tc_value1   = in_data[0].tc_value1   +  vec4(1.0);\n"
						"    gs_tc_value2   = in_data[0].tc_value2   + ivec4(1);\n"
						"    gs_te_position = in_data[0].te_position +  vec4(1.0);\n"
						"\n"
						"    EmitVertex();\n"
						"\n"
						"}\n";

		body_string  = body_sstream.str();
		body_raw_ptr = body_string.c_str();

		shaderSourceSpecialized(run.gs_id, 1 /* count */, &body_raw_ptr);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed for geometry shader");
	}

	/* Configure varyings */
	unsigned int	   n_varyings					= 0;
	int				   varying_tc_pointSize_offset  = -1;
	int				   varying_tc_position_offset   = -1;
	int				   varying_tc_value1_offset		= -1;
	int				   varying_tc_value2_offset		= -1;
	int				   varying_te_patch_data_offset = -1;
	int				   varying_te_pointSize_offset  = -1;
	int				   varying_te_position_offset   = -1;
	const unsigned int varying_patch_data_size		= sizeof(float) * 4; /*  vec4 */
	const unsigned int varying_pointSize_size		= sizeof(float);
	const unsigned int varying_position_size		= sizeof(float) * 4; /*  vec4 */
	const unsigned int varying_value1_size			= sizeof(float) * 4; /*  vec4 */
	const unsigned int varying_value2_size			= sizeof(int) * 4;   /* ivec4 */
	const char**	   varyings						= DE_NULL;
	unsigned int	   varyings_size				= 0;

	const char* gs_non_point_size_varyings[] = { "gs_tc_position", "gs_tc_value1", "gs_tc_value2", "gs_te_position" };
	const char* gs_point_size_varyings[]	 = { "gs_tc_position", "gs_tc_value1",	"gs_tc_value2",
											 "gs_te_position", "gs_tc_pointSize", "gs_te_pointSize" };
	const char* non_gs_non_point_size_varyings[] = { "tc_position", "tc_value1", "tc_value2", "te_position",
													 "te_patch_data" };
	const char* non_gs_point_size_varyings[] = { "tc_position",  "tc_value1",	"tc_value2",	"te_position",
												 "tc_pointSize", "te_pointSize", "te_patch_data" };

	if (should_use_geometry_shader)
	{
		if (should_pass_point_size_data_in_gs)
		{
			n_varyings	= sizeof(gs_point_size_varyings) / sizeof(gs_point_size_varyings[0]);
			varyings	  = gs_point_size_varyings;
			varyings_size = varying_position_size +  /* gs_tc_position  */
							varying_value1_size +	/* gs_tc_value1    */
							varying_value2_size +	/* gs_tc_value2    */
							varying_position_size +  /* gs_te_position  */
							varying_pointSize_size + /* gs_tc_pointSize */
							varying_pointSize_size;  /* gs_te_pointSize */

			varying_tc_position_offset  = 0;
			varying_tc_value1_offset	= varying_tc_position_offset + varying_position_size;
			varying_tc_value2_offset	= varying_tc_value1_offset + varying_value1_size;
			varying_te_position_offset  = varying_tc_value2_offset + varying_value2_size;
			varying_tc_pointSize_offset = varying_te_position_offset + varying_position_size;
			varying_te_pointSize_offset = varying_tc_pointSize_offset + varying_pointSize_size;
		}
		else
		{
			n_varyings	= sizeof(gs_non_point_size_varyings) / sizeof(gs_non_point_size_varyings[0]);
			varyings	  = gs_non_point_size_varyings;
			varyings_size = varying_position_size + /* gs_tc_position */
							varying_value1_size +   /* gs_tc_value1   */
							varying_value2_size +   /* gs_tc_value2   */
							varying_position_size;  /* gs_te_position */

			varying_tc_position_offset = 0;
			varying_tc_value1_offset   = varying_tc_position_offset + varying_position_size;
			varying_tc_value2_offset   = varying_tc_value1_offset + varying_value1_size;
			varying_te_position_offset = varying_tc_value2_offset + varying_value2_size;
		}
	} /* if (should_use_geometry_shader) */
	else
	{
		if (should_pass_point_size_data_in_ts)
		{
			n_varyings	= sizeof(non_gs_point_size_varyings) / sizeof(non_gs_point_size_varyings[0]);
			varyings	  = non_gs_point_size_varyings;
			varyings_size = varying_position_size +  /* tc_position   */
							varying_value1_size +	/* tc_value1     */
							varying_value2_size +	/* tc_value2     */
							varying_position_size +  /* te_position   */
							varying_pointSize_size + /* tc_pointSize  */
							varying_pointSize_size + /* te_pointSize  */
							varying_patch_data_size; /* tc_patch_data */

			varying_tc_position_offset   = 0;
			varying_tc_value1_offset	 = varying_tc_position_offset + varying_position_size;
			varying_tc_value2_offset	 = varying_tc_value1_offset + varying_value1_size;
			varying_te_position_offset   = varying_tc_value2_offset + varying_value2_size;
			varying_tc_pointSize_offset  = varying_te_position_offset + varying_position_size;
			varying_te_pointSize_offset  = varying_tc_pointSize_offset + varying_pointSize_size;
			varying_te_patch_data_offset = varying_te_pointSize_offset + varying_pointSize_size;
		}
		else
		{
			n_varyings	= sizeof(non_gs_non_point_size_varyings) / sizeof(non_gs_non_point_size_varyings[0]);
			varyings	  = non_gs_non_point_size_varyings;
			varyings_size = varying_position_size +  /* tc_position   */
							varying_value1_size +	/* tc_value1     */
							varying_value2_size +	/* tc_value2     */
							varying_position_size +  /* te_position   */
							varying_patch_data_size; /* tc_patch_data */

			varying_tc_position_offset   = 0;
			varying_tc_value1_offset	 = varying_tc_position_offset + varying_position_size;
			varying_tc_value2_offset	 = varying_tc_value1_offset + varying_value1_size;
			varying_te_position_offset   = varying_tc_value2_offset + varying_value2_size;
			varying_te_patch_data_offset = varying_te_position_offset + varying_position_size;
		}
	}

	gl.transformFeedbackVaryings(run.po_id, n_varyings, varyings, GL_INTERLEAVED_ATTRIBS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() call failed");

	/* Compile all the shader objects */
	const glw::GLuint  shaders[] = { run.fs_id, run.gs_id, run.tcs_id, run.tes_id, run.vs_id };
	const unsigned int n_shaders = sizeof(shaders) / sizeof(shaders[0]);

	for (unsigned int n_shader = 0; n_shader < n_shaders; ++n_shader)
	{
		glw::GLuint shader = shaders[n_shader];

		if (shader != 0)
		{
			m_utils_ptr->compileShaders(1 /* n_shaders */, &shader, true);
		}
	}

	/* Link the program object */
	gl.linkProgram(run.po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed");

	/* Make sure the linking has succeeded */
	glw::GLint link_status = GL_FALSE;

	gl.getProgramiv(run.po_id, GL_LINK_STATUS, &link_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() failed");

	if (link_status != GL_TRUE)
	{
		TCU_FAIL("Program linking failed");
	}

	/* Now that we have a linked program object, it's time to determine how much space
	 * we will need to hold XFB data.
	 */
	unsigned int bo_size			  = 0;
	unsigned int n_result_tess_coords = 0;
	const float  tess_levels[]		  = /* as per shaders constructed by the test */
		{ 4.0f, 4.0f, 4.0f, 4.0f };

	n_result_tess_coords = m_utils_ptr->getAmountOfVerticesGeneratedByTessellator(
		run.primitive_mode, tess_levels, tess_levels, TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,
		true); /* is_point_mode_enabled */

	if (should_use_geometry_shader)
	{
		/* Geometry shader will output twice as many vertices */
		n_result_tess_coords *= 2;
	}

	run.n_result_vertices_per_patch = n_result_tess_coords;
	n_result_tess_coords *= m_n_input_vertices_per_run;
	bo_size = n_result_tess_coords * varyings_size;

	/* Proceed with buffer object storage allocation */
	gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, bo_size, DE_NULL, /* data */
				  GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() call failed");

	/* Great, time to actually render the data! */
	glw::GLenum tf_mode =
		TessellationShaderUtils::getTFModeForPrimitiveMode(run.primitive_mode, true); /* is_point_mode_enabled */

	gl.useProgram(run.po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() failed");

	gl.beginTransformFeedback(tf_mode);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() failed");
	{
		gl.drawArrays(m_glExtTokens.PATCHES, 0 /* first */, m_n_input_vertices_per_run);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() failed");
	}
	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() failed");

	/* The data should have landed in the buffer object storage by now. Map the BO into
	 * process space. */
	const void* bo_ptr = gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* offset */
										   bo_size, GL_MAP_READ_BIT);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() failed");

	/* Extract varyings' data */
	for (unsigned int n_tess_coord = 0; n_tess_coord < n_result_tess_coords; ++n_tess_coord)
	{
		const char* data = (const char*)bo_ptr + n_tess_coord * varyings_size;

		if (varying_tc_position_offset != -1)
		{
			const float* position_data((const float*)(data + varying_tc_position_offset));
			_vec4		 new_entry(position_data[0], position_data[1], position_data[2], position_data[3]);

			run.result_tc_position_data.push_back(new_entry);
		}

		if (varying_tc_value1_offset != -1)
		{
			const float* value1_data((const float*)(data + varying_tc_value1_offset));
			_vec4		 new_entry(value1_data[0], value1_data[1], value1_data[2], value1_data[3]);

			run.result_tc_value1_data.push_back(new_entry);
		}

		if (varying_tc_value2_offset != -1)
		{
			const int* value2_data((const int*)(data + varying_tc_value2_offset));
			_ivec4	 new_entry(value2_data[0], value2_data[1], value2_data[2], value2_data[3]);

			run.result_tc_value2_data.push_back(new_entry);
		}

		if (varying_te_position_offset != -1)
		{
			const float* position_data((const float*)(data + varying_te_position_offset));
			_vec4		 new_entry(position_data[0], position_data[1], position_data[2], position_data[3]);

			run.result_te_position_data.push_back(new_entry);
		}

		if (varying_tc_pointSize_offset != -1)
		{
			const float* pointSize_ptr((const float*)(data + varying_tc_pointSize_offset));

			run.result_tc_pointSize_data.push_back(*pointSize_ptr);
		}

		if (varying_te_pointSize_offset != -1)
		{
			const float* pointSize_ptr((const float*)(data + varying_te_pointSize_offset));

			run.result_te_pointSize_data.push_back(*pointSize_ptr);
		}

		if (varying_te_patch_data_offset != -1)
		{
			const float* patch_data_ptr((const float*)(data + varying_te_patch_data_offset));
			_vec4		 new_entry(patch_data_ptr[0], patch_data_ptr[1], patch_data_ptr[2], patch_data_ptr[3]);

			run.result_te_patch_data.push_back(new_entry);
		}
	} /* for (all XFB data associated with tessellated coordinates) */

	/* Now that we're done extracting the data we need, we're fine to unmap the buffer object */
	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() failed");
}